

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O1

unsigned_long PaUtil_CopyOutput(PaUtilBufferProcessor *bp,void **buffer,unsigned_long frameCount)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  void *pvVar7;
  PaUtilChannelDescriptor *pPVar8;
  
  pPVar8 = bp->hostOutputChannels[0];
  if (bp->hostOutputFrameCount[0] < frameCount) {
    frameCount = bp->hostOutputFrameCount[0];
  }
  uVar4 = (uint)frameCount;
  if (bp->userOutputIsInterleaved == 0) {
    if (bp->outputChannelCount != 0) {
      pvVar7 = *buffer;
      uVar5 = 0;
      do {
        pvVar3 = *(void **)((long)pvVar7 + uVar5 * 8);
        (*bp->outputConverter)(pPVar8->data,pPVar8->stride,pvVar3,1,uVar4,&bp->ditherGenerator);
        *(ulong *)((long)pvVar7 + uVar5 * 8) =
             (ulong)(bp->bytesPerUserOutputSample * uVar4) + (long)pvVar3;
        pPVar8->data = (void *)((long)pPVar8->data +
                               (ulong)(pPVar8->stride * uVar4 * bp->bytesPerHostOutputSample));
        uVar5 = uVar5 + 1;
        pPVar8 = pPVar8 + 1;
      } while (uVar5 < bp->outputChannelCount);
    }
  }
  else {
    uVar1 = bp->outputChannelCount;
    uVar6 = uVar1;
    if (uVar1 != 0) {
      uVar2 = bp->bytesPerUserOutputSample;
      pvVar7 = *buffer;
      uVar5 = 0;
      do {
        (*bp->outputConverter)(pPVar8->data,pPVar8->stride,pvVar7,uVar1,uVar4,&bp->ditherGenerator);
        pvVar7 = (void *)((long)pvVar7 + (ulong)uVar2);
        pPVar8->data = (void *)((long)pPVar8->data +
                               (ulong)(pPVar8->stride * uVar4 * bp->bytesPerHostOutputSample));
        uVar5 = uVar5 + 1;
        uVar6 = bp->outputChannelCount;
        pPVar8 = pPVar8 + 1;
      } while (uVar5 < uVar6);
    }
    *buffer = (void *)((long)*buffer + (ulong)(uVar6 * uVar4 * bp->bytesPerUserOutputSample));
  }
  bp->hostOutputFrameCount[0] = bp->hostOutputFrameCount[0] + (frameCount & 0xffffffff);
  return frameCount & 0xffffffff;
}

Assistant:

unsigned long PaUtil_CopyOutput( PaUtilBufferProcessor* bp,
        const void ** buffer, unsigned long frameCount )
{
    PaUtilChannelDescriptor *hostOutputChannels;
    unsigned int framesToCopy;
    unsigned char *srcBytePtr;
    void **nonInterleavedSrcPtrs;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;

    hostOutputChannels = bp->hostOutputChannels[0];
    framesToCopy = PA_MIN_( bp->hostOutputFrameCount[0], frameCount );

    if( bp->userOutputIsInterleaved )
    {
        srcBytePtr = (unsigned char*)*buffer;

        srcSampleStrideSamples = bp->outputChannelCount;
        srcChannelStrideBytes = bp->bytesPerUserOutputSample;

        for( i=0; i<bp->outputChannelCount; ++i )
        {
            bp->outputConverter(    hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    srcBytePtr, srcSampleStrideSamples,
                                    framesToCopy, &bp->ditherGenerator );

            srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

            /* advance dest ptr for next iteration */
            hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                    framesToCopy * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
        }

        /* advance callers source pointer (buffer) */
        *buffer = ((unsigned char *)*buffer) +
                framesToCopy * bp->outputChannelCount * bp->bytesPerUserOutputSample;

    }
    else
    {
        /* user output is not interleaved */

        nonInterleavedSrcPtrs = (void**)*buffer;

        srcSampleStrideSamples = 1;

        for( i=0; i<bp->outputChannelCount; ++i )
        {
            srcBytePtr = (unsigned char*)nonInterleavedSrcPtrs[i];

            bp->outputConverter(    hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    srcBytePtr, srcSampleStrideSamples,
                                    framesToCopy, &bp->ditherGenerator );


            /* advance callers source pointer (nonInterleavedSrcPtrs[i]) */
            srcBytePtr += bp->bytesPerUserOutputSample * framesToCopy;
            nonInterleavedSrcPtrs[i] = srcBytePtr;

            /* advance dest ptr for next iteration */
            hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                    framesToCopy * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
        }
    }

    bp->hostOutputFrameCount[0] += framesToCopy;

    return framesToCopy;
}